

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easm_parse.c
# Opt level: O0

int easm_parse(void *lex_state,easm_file **res)

{
  char cVar1;
  undefined8 uVar2;
  uint64_t uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  size_t __n;
  yy_state_t *__dest;
  YYSTYPE *__dest_00;
  envy_loc *__dest_01;
  easm_swizzle *peVar9;
  void *pvVar10;
  undefined8 *puVar11;
  yysymbol_kind_t local_21b8;
  yysymbol_kind_t local_21b4;
  yysymbol_kind_t local_21b0;
  int local_21ac;
  int local_219c;
  int yyi;
  int yylhs;
  long yynewbytes_2;
  long yynewbytes_1;
  long yynewbytes;
  yyalloc *yyptr;
  yy_state_t *yyss1;
  long yysize;
  int yylen;
  envy_loc yyerror_range [3];
  envy_loc yyloc;
  YYSTYPE yyval;
  int local_20a0;
  yysymbol_kind_t yytoken;
  int yyresult;
  int yyn;
  envy_loc *yylsp;
  envy_loc *yyls;
  envy_loc yylsa [200];
  YYSTYPE *yyvsp;
  YYSTYPE *yyvs;
  YYSTYPE yyvsa [200];
  yy_state_t *yyssp;
  yy_state_t *yyss;
  yy_state_t yyssa [200];
  long yystacksize;
  int local_50;
  int yyerrstatus;
  yy_state_fast_t yystate;
  int easm_nerrs;
  envy_loc yylloc;
  YYSTYPE yylval;
  int yychar;
  easm_file **res_local;
  void *lex_state_local;
  
  uVar5 = easm_parse::yyval_default.astr.len;
  yylloc.file = easm_parse::yyval_default.str;
  _yystate = (envy_loc *)easm_parse::yyloc_default._0_8_;
  yylloc._0_8_ = easm_parse::yyloc_default._8_8_;
  yylloc._8_8_ = easm_parse::yyloc_default.file;
  local_50 = 0;
  yystacksize._4_4_ = 0;
  yyssa[0xc0] = -0x38;
  yyssa[0xc1] = '\0';
  yyssa[0xc2] = '\0';
  yyssa[0xc3] = '\0';
  yyssa[0xc4] = '\0';
  yyssa[0xc5] = '\0';
  yyssa[0xc6] = '\0';
  yyssa[199] = '\0';
  yylsa[199].file = (char *)&yyvs;
  _yyresult = (envy_loc *)&yyls;
  yylval.astr.len._4_4_ = 0xfffffffe;
  yyls = (envy_loc *)easm_parse::yyloc_default._0_8_;
  yylsa[0]._0_8_ = easm_parse::yyloc_default._8_8_;
  yylsa[0]._8_8_ = easm_parse::yyloc_default.file;
  yyvsa[199]._8_8_ = &yyss;
  yylsp = _yyresult;
  yyvsp = (YYSTYPE *)yylsa[199].file;
  yyssp = (yy_state_t *)yyvsa[199]._8_8_;
  for (; *(char *)yyvsa[199]._8_8_ = (char)local_50,
      (ulong)yyvsa[199]._8_8_ < yyssp + yyssa._192_8_ + -1;
      yyvsa[199]._8_8_ = yyvsa[199].astr.len + 1) {
LAB_0024f548:
    if (local_50 == 3) {
      local_20a0 = 0;
      goto LAB_00251752;
    }
    cVar1 = yypact[local_50];
    if (cVar1 == -0x3b) {
LAB_0024f721:
      yytoken = (yysymbol_kind_t)"\x04"[local_50];
      if (yytoken == YYSYMBOL_YYEOF) {
        if (yylval.astr.len._4_4_ == -2) {
          local_21b0 = YYSYMBOL_YYEMPTY;
        }
        else {
          if (((int)yylval.astr.len._4_4_ < 0) || (0x115 < (int)yylval.astr.len._4_4_)) {
            local_21b4 = YYSYMBOL_YYUNDEF;
          }
          else {
            local_21b4 = (yysymbol_kind_t)""[(int)yylval.astr.len._4_4_];
          }
          local_21b0 = local_21b4;
        }
        if (yystacksize._4_4_ == 0) {
          easm_error((envy_loc *)&yystate,lex_state,res,"syntax error");
        }
        yyerror_range[0].file = (char *)_yystate;
        yyerror_range[1].lend = yylloc.lend;
        yyerror_range[1].cend = yylloc.cend;
        if (yystacksize._4_4_ == 3) {
          if ((int)yylval._12_4_ < 1) {
            if (yylval.astr.len._4_4_ == 0) goto LAB_00251724;
          }
          else {
            yydestruct("Error: discarding",local_21b0,(YYSTYPE *)&yylloc.file,(envy_loc *)&yystate,
                       lex_state,res);
            yylval.astr.len._4_4_ = 0xfffffffe;
          }
        }
LAB_00251520:
        yystacksize._4_4_ = 3;
        while (((yypact[local_50] == -0x3b || (iVar7 = yypact[local_50] + 1, iVar7 < 0)) ||
               ((0x97 < iVar7 ||
                (("\x16;<\'\x1b\r\x0e\x0e"[iVar7] != '\x01' || (cVar1 = yytable[iVar7], cVar1 < 1)))
                )))) {
          if ((yy_state_t *)yyvsa[199]._8_8_ == yyssp) goto LAB_00251724;
          yyerror_range[0].file = *(char **)_yyresult;
          yyerror_range[1]._8_8_ = _yyresult->file;
          yydestruct("Error: popping",(int)""[local_50],(YYSTYPE *)yylsa[199].file,_yyresult,
                     lex_state,res);
          yylsa[199].file = yylsa[199].file + -0x10;
          yyvsa[199]._8_8_ = yyvsa[199].astr.len - 1;
          _yyresult = _yyresult + -1;
          local_50 = (int)*(char *)yyvsa[199]._8_8_;
        }
        *(char **)(yylsa[199].file + 0x10) = yylloc.file;
        *(undefined8 *)(yylsa[199].file + 0x18) = uVar5;
        _yyresult[1].lstart = (int)yyerror_range[0].file;
        _yyresult[1].cstart = yyerror_range[0].file._4_4_;
        yyerror_range[2].lstart = yylloc.lstart;
        _yyresult[1].lend = yyerror_range[2].lstart;
        yyerror_range[2].cstart = yylloc.cstart;
        _yyresult[1].cend = yyerror_range[2].cstart;
        _yyresult[1].file = (char *)yyerror_range[1]._8_8_;
        _yyresult = _yyresult + 1;
        yylsa[199].file = yylsa[199].file + 0x10;
        local_50 = (int)cVar1;
      }
      else {
LAB_0024f746:
        iVar7 = (int)""[yytoken];
        yyloc.file = *(char **)(yylsa[199].file + (long)(1 - iVar7) * 0x10);
        uVar2 = *(undefined8 *)(yylsa[199].file + (long)(1 - iVar7) * 0x10 + 8);
        if (iVar7 == 0) {
          yyerror_range[2].file._0_4_ = yystate;
          yyerror_range[2].file._4_4_ = easm_nerrs;
          yyloc.lstart = yystate;
          yyloc.cstart = easm_nerrs;
          yyloc.lend = yylloc.lend;
          yyloc.cend = yylloc.cend;
        }
        else {
          yyerror_range[2].file._0_4_ = _yyresult[1 - (long)iVar7].lstart;
          yyerror_range[2].file._4_4_ = _yyresult[1 - (long)iVar7].cstart;
          yyloc.lstart = _yyresult[(long)iVar7 - (long)iVar7].lend;
          yyloc.cstart = _yyresult[(long)iVar7 - (long)iVar7].cend;
          yyloc._8_8_ = _yyresult[1 - (long)iVar7].file;
        }
        switch(yytoken) {
        case YYSYMBOL_YYUNDEF:
          *res = *(easm_file **)yylsa[199].file;
          break;
        case YYSYMBOL_T_SHL:
          yyloc.file = *(char **)(yylsa[199].file + -0x10);
          if (*(long *)yylsa[199].file != 0) {
            if (*(int *)((long)yyloc.file + 0xc) <= (int)*(long *)((long)yyloc.file + 8)) {
              if (*(int *)((long)yyloc.file + 0xc) == 0) {
                *(undefined4 *)((long)yyloc.file + 0xc) = 0x10;
              }
              else {
                *(int *)((long)yyloc.file + 0xc) = *(int *)((long)yyloc.file + 0xc) << 1;
              }
              pvVar10 = realloc(*(void **)yyloc.file,(long)*(int *)((long)yyloc.file + 0xc) << 3);
              *(void **)yyloc.file = pvVar10;
            }
            uVar4 = *(undefined8 *)yylsa[199].file;
            lVar8 = *(long *)((long)yyloc.file + 8);
            *(int *)((long)yyloc.file + 8) = (int)lVar8 + 1;
            *(undefined8 *)(*(long *)yyloc.file + (long)(int)lVar8 * 8) = uVar4;
          }
          break;
        case YYSYMBOL_T_SHR:
          yyloc.file = (char *)calloc(0x10,1);
          break;
        case YYSYMBOL_T_LOR:
          yyloc.file = (char *)calloc(0x38,1);
          *(ulong *)(yyloc.file + 0x20) =
               CONCAT44(yyerror_range[2].file._4_4_,(int)yyerror_range[2].file);
          *(ulong *)(yyloc.file + 0x28) = CONCAT44(yyloc.cstart,yyloc.lstart);
          *(undefined8 *)(yyloc.file + 0x30) = yyloc._8_8_;
          yyloc.file[0] = '\x01';
          yyloc.file[1] = '\0';
          yyloc.file[2] = '\0';
          yyloc.file[3] = '\0';
          *(undefined8 *)(yyloc.file + 0x10) = *(undefined8 *)(yylsa[199].file + -0x10);
          break;
        case YYSYMBOL_T_LAND:
          yyloc.file = (char *)calloc(0x38,1);
          *(ulong *)(yyloc.file + 0x20) =
               CONCAT44(yyerror_range[2].file._4_4_,(int)yyerror_range[2].file);
          *(ulong *)(yyloc.file + 0x28) = CONCAT44(yyloc.cstart,yyloc.lstart);
          *(undefined8 *)(yyloc.file + 0x30) = yyloc._8_8_;
          yyloc.file[0] = '\0';
          yyloc.file[1] = '\0';
          yyloc.file[2] = '\0';
          yyloc.file[3] = '\0';
          *(undefined8 *)(yyloc.file + 8) = *(undefined8 *)(yylsa[199].file + -0x10);
          break;
        case YYSYMBOL_T_UMINUS:
          yyloc.file = (char *)calloc(0x38,1);
          *(ulong *)(yyloc.file + 0x20) =
               CONCAT44(yyerror_range[2].file._4_4_,(int)yyerror_range[2].file);
          *(ulong *)(yyloc.file + 0x28) = CONCAT44(yyloc.cstart,yyloc.lstart);
          *(undefined8 *)(yyloc.file + 0x30) = yyloc._8_8_;
          yyloc.file[0] = '\x02';
          yyloc.file[1] = '\0';
          yyloc.file[2] = '\0';
          yyloc.file[3] = '\0';
          *(undefined8 *)(yyloc.file + 0x18) = *(undefined8 *)yylsa[199].file;
          break;
        case YYSYMBOL_T_PLUSPLUS:
          yyloc.file = (char *)0x0;
          break;
        default:
          break;
        case YYSYMBOL_T_MINUSEQ:
          yyloc.file = (char *)calloc(0x30,1);
          *(ulong *)(yyloc.file + 0x18) =
               CONCAT44(yyerror_range[2].file._4_4_,(int)yyerror_range[2].file);
          *(ulong *)(yyloc.file + 0x20) = CONCAT44(yyloc.cstart,yyloc.lstart);
          *(undefined8 *)(yyloc.file + 0x28) = yyloc._8_8_;
          *(undefined8 *)yyloc.file = *(undefined8 *)yylsa[199].file;
          break;
        case YYSYMBOL_T_DOTLP:
          yyloc.file = *(char **)(yylsa[199].file + -0x10);
          *(ulong *)(yyloc.file + 0x18) =
               CONCAT44(yyerror_range[2].file._4_4_,(int)yyerror_range[2].file);
          *(ulong *)(yyloc.file + 0x20) = CONCAT44(yyloc.cstart,yyloc.lstart);
          *(undefined8 *)(yyloc.file + 0x28) = yyloc._8_8_;
          if (*(int *)(yyloc.file + 0x14) <= *(int *)(yyloc.file + 0x10)) {
            if (*(int *)(yyloc.file + 0x14) == 0) {
              yyloc.file[0x14] = '\x10';
              yyloc.file[0x15] = '\0';
              yyloc.file[0x16] = '\0';
              yyloc.file[0x17] = '\0';
            }
            else {
              *(int *)(yyloc.file + 0x14) = *(int *)(yyloc.file + 0x14) << 1;
            }
            pvVar10 = realloc(*(void **)(yyloc.file + 8),(long)*(int *)(yyloc.file + 0x14) << 3);
            *(void **)(yyloc.file + 8) = pvVar10;
          }
          uVar4 = *(undefined8 *)yylsa[199].file;
          iVar6 = *(int *)(yyloc.file + 0x10);
          *(int *)(yyloc.file + 0x10) = iVar6 + 1;
          *(undefined8 *)(*(long *)(yyloc.file + 8) + (long)iVar6 * 8) = uVar4;
          break;
        case YYSYMBOL_T_ERR:
          yyloc.file = (char *)calloc(0x28,1);
          *(long *)((long)yyloc.file + 0x10) =
               CONCAT44(yyerror_range[2].file._4_4_,(int)yyerror_range[2].file);
          *(long *)((long)yyloc.file + 0x18) = CONCAT44(yyloc.cstart,yyloc.lstart);
          *(undefined8 *)((long)yyloc.file + 0x20) = yyloc._8_8_;
          if (*(int *)((long)yyloc.file + 0xc) <= (int)*(long *)((long)yyloc.file + 8)) {
            if (*(int *)((long)yyloc.file + 0xc) == 0) {
              *(undefined4 *)((long)yyloc.file + 0xc) = 0x10;
            }
            else {
              *(int *)((long)yyloc.file + 0xc) = *(int *)((long)yyloc.file + 0xc) << 1;
            }
            pvVar10 = realloc(*(void **)yyloc.file,(long)*(int *)((long)yyloc.file + 0xc) << 3);
            *(void **)yyloc.file = pvVar10;
          }
          uVar4 = *(undefined8 *)yylsa[199].file;
          lVar8 = *(long *)((long)yyloc.file + 8);
          *(int *)((long)yyloc.file + 8) = (int)lVar8 + 1;
          *(undefined8 *)(*(long *)yyloc.file + (long)(int)lVar8 * 8) = uVar4;
          break;
        case YYSYMBOL_T_NUM:
          yyloc.file = *(char **)(yylsa[199].file + -0x20);
          *(long *)((long)yyloc.file + 0x10) =
               CONCAT44(yyerror_range[2].file._4_4_,(int)yyerror_range[2].file);
          *(long *)((long)yyloc.file + 0x18) = CONCAT44(yyloc.cstart,yyloc.lstart);
          *(undefined8 *)((long)yyloc.file + 0x20) = yyloc._8_8_;
          if (*(int *)((long)yyloc.file + 0xc) <= (int)*(long *)((long)yyloc.file + 8)) {
            if (*(int *)((long)yyloc.file + 0xc) == 0) {
              *(undefined4 *)((long)yyloc.file + 0xc) = 0x10;
            }
            else {
              *(int *)((long)yyloc.file + 0xc) = *(int *)((long)yyloc.file + 0xc) << 1;
            }
            pvVar10 = realloc(*(void **)yyloc.file,(long)*(int *)((long)yyloc.file + 0xc) << 3);
            *(void **)yyloc.file = pvVar10;
          }
          uVar4 = *(undefined8 *)yylsa[199].file;
          lVar8 = *(long *)((long)yyloc.file + 8);
          *(int *)((long)yyloc.file + 8) = (int)lVar8 + 1;
          *(undefined8 *)(*(long *)yyloc.file + (long)(int)lVar8 * 8) = uVar4;
          break;
        case YYSYMBOL_T_DOTNUM:
          yyloc.file = *(char **)(yylsa[199].file + -0x30);
          *(long *)((long)yyloc.file + 0x10) =
               CONCAT44(yyerror_range[2].file._4_4_,(int)yyerror_range[2].file);
          *(long *)((long)yyloc.file + 0x18) = CONCAT44(yyloc.cstart,yyloc.lstart);
          *(undefined8 *)((long)yyloc.file + 0x20) = yyloc._8_8_;
          if (*(int *)((long)yyloc.file + 0xc) <= (int)*(long *)((long)yyloc.file + 8)) {
            if (*(int *)((long)yyloc.file + 0xc) == 0) {
              *(undefined4 *)((long)yyloc.file + 0xc) = 0x10;
            }
            else {
              *(int *)((long)yyloc.file + 0xc) = *(int *)((long)yyloc.file + 0xc) << 1;
            }
            pvVar10 = realloc(*(void **)yyloc.file,(long)*(int *)((long)yyloc.file + 0xc) << 3);
            *(void **)yyloc.file = pvVar10;
          }
          uVar4 = *(undefined8 *)yylsa[199].file;
          lVar8 = *(long *)((long)yyloc.file + 8);
          *(int *)((long)yyloc.file + 8) = (int)lVar8 + 1;
          *(undefined8 *)(*(long *)yyloc.file + (long)(int)lVar8 * 8) = uVar4;
          break;
        case YYSYMBOL_T_WORD:
          yyloc.file = *(char **)(yylsa[199].file + -0x30);
          *(long *)((long)yyloc.file + 0x10) =
               CONCAT44(yyerror_range[2].file._4_4_,(int)yyerror_range[2].file);
          *(long *)((long)yyloc.file + 0x18) = CONCAT44(yyloc.cstart,yyloc.lstart);
          *(undefined8 *)((long)yyloc.file + 0x20) = yyloc._8_8_;
          if (*(int *)((long)yyloc.file + 0xc) <= (int)*(long *)((long)yyloc.file + 8)) {
            if (*(int *)((long)yyloc.file + 0xc) == 0) {
              *(undefined4 *)((long)yyloc.file + 0xc) = 0x10;
            }
            else {
              *(int *)((long)yyloc.file + 0xc) = *(int *)((long)yyloc.file + 0xc) << 1;
            }
            pvVar10 = realloc(*(void **)yyloc.file,(long)*(int *)((long)yyloc.file + 0xc) << 3);
            *(void **)yyloc.file = pvVar10;
          }
          uVar4 = *(undefined8 *)yylsa[199].file;
          lVar8 = *(long *)((long)yyloc.file + 8);
          *(int *)((long)yyloc.file + 8) = (int)lVar8 + 1;
          *(undefined8 *)(*(long *)yyloc.file + (long)(int)lVar8 * 8) = uVar4;
          break;
        case YYSYMBOL_T_WORDC:
          yyloc.file = *(char **)(yylsa[199].file + -0x10);
          *(ulong *)(yyloc.file + 0x18) =
               CONCAT44(yyerror_range[2].file._4_4_,(int)yyerror_range[2].file);
          *(ulong *)(yyloc.file + 0x20) = CONCAT44(yyloc.cstart,yyloc.lstart);
          *(undefined8 *)(yyloc.file + 0x28) = yyloc._8_8_;
          *(undefined8 *)(yyloc.file + 0x10) = *(undefined8 *)yylsa[199].file;
          break;
        case YYSYMBOL_T_WORDLB:
          yyloc.file = *(char **)(yylsa[199].file + -0x10);
          if (*(int *)((long)yyloc.file + 0xc) <= (int)*(long *)((long)yyloc.file + 8)) {
            if (*(int *)((long)yyloc.file + 0xc) == 0) {
              *(undefined4 *)((long)yyloc.file + 0xc) = 0x10;
            }
            else {
              *(int *)((long)yyloc.file + 0xc) = *(int *)((long)yyloc.file + 0xc) << 1;
            }
            pvVar10 = realloc(*(void **)yyloc.file,(long)*(int *)((long)yyloc.file + 0xc) << 3);
            *(void **)yyloc.file = pvVar10;
          }
          uVar4 = *(undefined8 *)yylsa[199].file;
          lVar8 = *(long *)((long)yyloc.file + 8);
          *(int *)((long)yyloc.file + 8) = (int)lVar8 + 1;
          *(undefined8 *)(*(long *)yyloc.file + (long)(int)lVar8 * 8) = uVar4;
          break;
        case YYSYMBOL_T_DOTWORD:
          yyloc.file = (char *)calloc(0x30,1);
          break;
        case YYSYMBOL_T_HASHWORD:
          yyloc.file = *(char **)(yylsa[199].file + -0x10);
          *(ulong *)(yyloc.file + 0x28) =
               CONCAT44(yyerror_range[2].file._4_4_,(int)yyerror_range[2].file);
          *(ulong *)(yyloc.file + 0x30) = CONCAT44(yyloc.cstart,yyloc.lstart);
          *(undefined8 *)(yyloc.file + 0x38) = yyloc._8_8_;
          *(undefined8 *)yyloc.file = *(undefined8 *)(yylsa[199].file + -0x20);
          *(undefined8 *)(yyloc.file + 0x10) = *(undefined8 *)yylsa[199].file;
          break;
        case YYSYMBOL_T_DOLWORD:
          yyloc.file = *(char **)(yylsa[199].file + -0x10);
          if (*(int *)(yyloc.file + 0x24) <= *(int *)(yyloc.file + 0x20)) {
            if (*(int *)(yyloc.file + 0x24) == 0) {
              yyloc.file[0x24] = '\x10';
              yyloc.file[0x25] = '\0';
              yyloc.file[0x26] = '\0';
              yyloc.file[0x27] = '\0';
            }
            else {
              *(int *)(yyloc.file + 0x24) = *(int *)(yyloc.file + 0x24) << 1;
            }
            pvVar10 = realloc(*(void **)(yyloc.file + 0x18),(long)*(int *)(yyloc.file + 0x24) << 3);
            *(void **)(yyloc.file + 0x18) = pvVar10;
          }
          uVar4 = *(undefined8 *)yylsa[199].file;
          iVar6 = *(int *)(yyloc.file + 0x20);
          *(int *)(yyloc.file + 0x20) = iVar6 + 1;
          *(undefined8 *)(*(long *)(yyloc.file + 0x18) + (long)iVar6 * 8) = uVar4;
          break;
        case YYSYMBOL_T_STR:
          yyloc.file = (char *)calloc(0x40,1);
          break;
        case YYSYMBOL_23_n_:
          yyloc.file = (char *)calloc(0x30,1);
          *(ulong *)(yyloc.file + 0x18) =
               CONCAT44(yyerror_range[2].file._4_4_,(int)yyerror_range[2].file);
          *(ulong *)(yyloc.file + 0x20) = CONCAT44(yyloc.cstart,yyloc.lstart);
          *(undefined8 *)(yyloc.file + 0x28) = yyloc._8_8_;
          *(undefined8 *)yyloc.file = *(undefined8 *)(yylsa[199].file + -0x10);
          if (*(int *)(yyloc.file + 0x14) <= *(int *)(yyloc.file + 0x10)) {
            if (*(int *)(yyloc.file + 0x14) == 0) {
              yyloc.file[0x14] = '\x10';
              yyloc.file[0x15] = '\0';
              yyloc.file[0x16] = '\0';
              yyloc.file[0x17] = '\0';
            }
            else {
              *(int *)(yyloc.file + 0x14) = *(int *)(yyloc.file + 0x14) << 1;
            }
            pvVar10 = realloc(*(void **)(yyloc.file + 8),(long)*(int *)(yyloc.file + 0x14) << 3);
            *(void **)(yyloc.file + 8) = pvVar10;
          }
          uVar4 = *(undefined8 *)yylsa[199].file;
          iVar6 = *(int *)(yyloc.file + 0x10);
          *(int *)(yyloc.file + 0x10) = iVar6 + 1;
          *(undefined8 *)(*(long *)(yyloc.file + 8) + (long)iVar6 * 8) = uVar4;
          break;
        case YYSYMBOL_24_:
          yyloc.file = *(char **)(yylsa[199].file + -0x20);
          *(ulong *)(yyloc.file + 0x18) =
               CONCAT44(yyerror_range[2].file._4_4_,(int)yyerror_range[2].file);
          *(ulong *)(yyloc.file + 0x20) = CONCAT44(yyloc.cstart,yyloc.lstart);
          *(undefined8 *)(yyloc.file + 0x28) = yyloc._8_8_;
          if (*(int *)(yyloc.file + 0x14) <= *(int *)(yyloc.file + 0x10)) {
            if (*(int *)(yyloc.file + 0x14) == 0) {
              yyloc.file[0x14] = '\x10';
              yyloc.file[0x15] = '\0';
              yyloc.file[0x16] = '\0';
              yyloc.file[0x17] = '\0';
            }
            else {
              *(int *)(yyloc.file + 0x14) = *(int *)(yyloc.file + 0x14) << 1;
            }
            pvVar10 = realloc(*(void **)(yyloc.file + 8),(long)*(int *)(yyloc.file + 0x14) << 3);
            *(void **)(yyloc.file + 8) = pvVar10;
          }
          uVar4 = *(undefined8 *)yylsa[199].file;
          iVar6 = *(int *)(yyloc.file + 0x10);
          *(int *)(yyloc.file + 0x10) = iVar6 + 1;
          *(undefined8 *)(*(long *)(yyloc.file + 8) + (long)iVar6 * 8) = uVar4;
          break;
        case YYSYMBOL_25_:
          yyloc.file = (char *)calloc(0x28,1);
          *(undefined8 *)yyloc.file = *(undefined8 *)yylsa[199].file;
          *(ulong *)(yyloc.file + 0x10) =
               CONCAT44(yyerror_range[2].file._4_4_,(int)yyerror_range[2].file);
          *(ulong *)(yyloc.file + 0x18) = CONCAT44(yyloc.cstart,yyloc.lstart);
          *(undefined8 *)(yyloc.file + 0x20) = yyloc._8_8_;
          break;
        case YYSYMBOL_26_:
          yyloc.file = *(char **)(yylsa[199].file + -0x10);
          if (*(int *)((long)yyloc.file + 0xc) <= (int)*(long *)((long)yyloc.file + 8)) {
            if (*(int *)((long)yyloc.file + 0xc) == 0) {
              *(undefined4 *)((long)yyloc.file + 0xc) = 0x10;
            }
            else {
              *(int *)((long)yyloc.file + 0xc) = *(int *)((long)yyloc.file + 0xc) << 1;
            }
            pvVar10 = realloc(*(void **)yyloc.file,(long)*(int *)((long)yyloc.file + 0xc) << 3);
            *(void **)yyloc.file = pvVar10;
          }
          uVar4 = *(undefined8 *)yylsa[199].file;
          lVar8 = *(long *)((long)yyloc.file + 8);
          *(int *)((long)yyloc.file + 8) = (int)lVar8 + 1;
          *(undefined8 *)(*(long *)yyloc.file + (long)(int)lVar8 * 8) = uVar4;
          *(long *)((long)yyloc.file + 0x10) =
               CONCAT44(yyerror_range[2].file._4_4_,(int)yyerror_range[2].file);
          *(long *)((long)yyloc.file + 0x18) = CONCAT44(yyloc.cstart,yyloc.lstart);
          *(undefined8 *)((long)yyloc.file + 0x20) = yyloc._8_8_;
          break;
        case YYSYMBOL_27_:
          yyloc.file = (char *)calloc(0x28,1);
          *(ulong *)(yyloc.file + 0x10) =
               CONCAT44(yyerror_range[2].file._4_4_,(int)yyerror_range[2].file);
          *(ulong *)(yyloc.file + 0x18) = CONCAT44(yyloc.cstart,yyloc.lstart);
          *(undefined8 *)(yyloc.file + 0x20) = yyloc._8_8_;
          break;
        case YYSYMBOL_28_:
          yyloc.file = (char *)easm_expr_bin(EASM_EXPR_VEC,*(easm_expr **)(yylsa[199].file + -0x20),
                                             *(easm_expr **)yylsa[199].file);
          (((easm_expr *)yyloc.file)->loc).lstart = (int)yyerror_range[2].file;
          (((easm_expr *)yyloc.file)->loc).cstart = yyerror_range[2].file._4_4_;
          (((easm_expr *)yyloc.file)->loc).lend = yyloc.lstart;
          (((easm_expr *)yyloc.file)->loc).cend = yyloc.cstart;
          (((easm_expr *)yyloc.file)->loc).file = (char *)yyloc._8_8_;
          break;
        case YYSYMBOL_30_:
          yyloc.file = (char *)easm_expr_bin(EASM_EXPR_LOR,*(easm_expr **)(yylsa[199].file + -0x20),
                                             *(easm_expr **)yylsa[199].file);
          (((easm_expr *)yyloc.file)->loc).lstart = (int)yyerror_range[2].file;
          (((easm_expr *)yyloc.file)->loc).cstart = yyerror_range[2].file._4_4_;
          (((easm_expr *)yyloc.file)->loc).lend = yyloc.lstart;
          (((easm_expr *)yyloc.file)->loc).cend = yyloc.cstart;
          (((easm_expr *)yyloc.file)->loc).file = (char *)yyloc._8_8_;
          break;
        case YYSYMBOL_32_:
          yyloc.file = (char *)easm_expr_bin(EASM_EXPR_LAND,*(easm_expr **)(yylsa[199].file + -0x20)
                                             ,*(easm_expr **)yylsa[199].file);
          (((easm_expr *)yyloc.file)->loc).lstart = (int)yyerror_range[2].file;
          (((easm_expr *)yyloc.file)->loc).cstart = yyerror_range[2].file._4_4_;
          (((easm_expr *)yyloc.file)->loc).lend = yyloc.lstart;
          (((easm_expr *)yyloc.file)->loc).cend = yyloc.cstart;
          (((easm_expr *)yyloc.file)->loc).file = (char *)yyloc._8_8_;
          break;
        case YYSYMBOL_34_:
          yyloc.file = (char *)easm_expr_bin(EASM_EXPR_OR,*(easm_expr **)(yylsa[199].file + -0x20),
                                             *(easm_expr **)yylsa[199].file);
          (((easm_expr *)yyloc.file)->loc).lstart = (int)yyerror_range[2].file;
          (((easm_expr *)yyloc.file)->loc).cstart = yyerror_range[2].file._4_4_;
          (((easm_expr *)yyloc.file)->loc).lend = yyloc.lstart;
          (((easm_expr *)yyloc.file)->loc).cend = yyloc.cstart;
          (((easm_expr *)yyloc.file)->loc).file = (char *)yyloc._8_8_;
          break;
        case YYSYMBOL_36_:
          yyloc.file = (char *)easm_expr_bin(EASM_EXPR_XOR,*(easm_expr **)(yylsa[199].file + -0x20),
                                             *(easm_expr **)yylsa[199].file);
          (((easm_expr *)yyloc.file)->loc).lstart = (int)yyerror_range[2].file;
          (((easm_expr *)yyloc.file)->loc).cstart = yyerror_range[2].file._4_4_;
          (((easm_expr *)yyloc.file)->loc).lend = yyloc.lstart;
          (((easm_expr *)yyloc.file)->loc).cend = yyloc.cstart;
          (((easm_expr *)yyloc.file)->loc).file = (char *)yyloc._8_8_;
          break;
        case YYSYMBOL_38_:
          yyloc.file = (char *)easm_expr_bin(EASM_EXPR_AND,*(easm_expr **)(yylsa[199].file + -0x20),
                                             *(easm_expr **)yylsa[199].file);
          (((easm_expr *)yyloc.file)->loc).lstart = (int)yyerror_range[2].file;
          (((easm_expr *)yyloc.file)->loc).cstart = yyerror_range[2].file._4_4_;
          (((easm_expr *)yyloc.file)->loc).lend = yyloc.lstart;
          (((easm_expr *)yyloc.file)->loc).cend = yyloc.cstart;
          (((easm_expr *)yyloc.file)->loc).file = (char *)yyloc._8_8_;
          break;
        case YYSYMBOL_40_:
          yyloc.file = (char *)easm_expr_bin(EASM_EXPR_SHL,*(easm_expr **)(yylsa[199].file + -0x20),
                                             *(easm_expr **)yylsa[199].file);
          (((easm_expr *)yyloc.file)->loc).lstart = (int)yyerror_range[2].file;
          (((easm_expr *)yyloc.file)->loc).cstart = yyerror_range[2].file._4_4_;
          (((easm_expr *)yyloc.file)->loc).lend = yyloc.lstart;
          (((easm_expr *)yyloc.file)->loc).cend = yyloc.cstart;
          (((easm_expr *)yyloc.file)->loc).file = (char *)yyloc._8_8_;
          break;
        case YYSYMBOL_YYACCEPT:
          yyloc.file = (char *)easm_expr_bin(EASM_EXPR_SHR,*(easm_expr **)(yylsa[199].file + -0x20),
                                             *(easm_expr **)yylsa[199].file);
          (((easm_expr *)yyloc.file)->loc).lstart = (int)yyerror_range[2].file;
          (((easm_expr *)yyloc.file)->loc).cstart = yyerror_range[2].file._4_4_;
          (((easm_expr *)yyloc.file)->loc).lend = yyloc.lstart;
          (((easm_expr *)yyloc.file)->loc).cend = yyloc.cstart;
          (((easm_expr *)yyloc.file)->loc).file = (char *)yyloc._8_8_;
          break;
        case YYSYMBOL_file:
          yyloc.file = (char *)easm_expr_bin(EASM_EXPR_VEC,*(easm_expr **)(yylsa[199].file + -0x20),
                                             *(easm_expr **)yylsa[199].file);
          (((easm_expr *)yyloc.file)->loc).lstart = (int)yyerror_range[2].file;
          (((easm_expr *)yyloc.file)->loc).cstart = yyerror_range[2].file._4_4_;
          (((easm_expr *)yyloc.file)->loc).lend = yyloc.lstart;
          (((easm_expr *)yyloc.file)->loc).cend = yyloc.cstart;
          (((easm_expr *)yyloc.file)->loc).file = (char *)yyloc._8_8_;
          break;
        case YYSYMBOL_eol:
          yyloc.file = (char *)easm_expr_bin(EASM_EXPR_ADD,*(easm_expr **)(yylsa[199].file + -0x20),
                                             *(easm_expr **)yylsa[199].file);
          (((easm_expr *)yyloc.file)->loc).lstart = (int)yyerror_range[2].file;
          (((easm_expr *)yyloc.file)->loc).cstart = yyerror_range[2].file._4_4_;
          (((easm_expr *)yyloc.file)->loc).lend = yyloc.lstart;
          (((easm_expr *)yyloc.file)->loc).cend = yyloc.cstart;
          (((easm_expr *)yyloc.file)->loc).file = (char *)yyloc._8_8_;
          break;
        case YYSYMBOL_direct:
          yyloc.file = (char *)easm_expr_bin(EASM_EXPR_SUB,*(easm_expr **)(yylsa[199].file + -0x20),
                                             *(easm_expr **)yylsa[199].file);
          (((easm_expr *)yyloc.file)->loc).lstart = (int)yyerror_range[2].file;
          (((easm_expr *)yyloc.file)->loc).cstart = yyerror_range[2].file._4_4_;
          (((easm_expr *)yyloc.file)->loc).lend = yyloc.lstart;
          (((easm_expr *)yyloc.file)->loc).cend = yyloc.cstart;
          (((easm_expr *)yyloc.file)->loc).file = (char *)yyloc._8_8_;
          break;
        case YYSYMBOL_subinsn:
          yyloc.file = (char *)easm_expr_bin(EASM_EXPR_MUL,*(easm_expr **)(yylsa[199].file + -0x20),
                                             *(easm_expr **)yylsa[199].file);
          (((easm_expr *)yyloc.file)->loc).lstart = (int)yyerror_range[2].file;
          (((easm_expr *)yyloc.file)->loc).cstart = yyerror_range[2].file._4_4_;
          (((easm_expr *)yyloc.file)->loc).lend = yyloc.lstart;
          (((easm_expr *)yyloc.file)->loc).cend = yyloc.cstart;
          (((easm_expr *)yyloc.file)->loc).file = (char *)yyloc._8_8_;
          break;
        case YYSYMBOL_prefs:
          yyloc.file = (char *)easm_expr_bin(EASM_EXPR_DIV,*(easm_expr **)(yylsa[199].file + -0x20),
                                             *(easm_expr **)yylsa[199].file);
          (((easm_expr *)yyloc.file)->loc).lstart = (int)yyerror_range[2].file;
          (((easm_expr *)yyloc.file)->loc).cstart = yyerror_range[2].file._4_4_;
          (((easm_expr *)yyloc.file)->loc).lend = yyloc.lstart;
          (((easm_expr *)yyloc.file)->loc).cend = yyloc.cstart;
          (((easm_expr *)yyloc.file)->loc).file = (char *)yyloc._8_8_;
          break;
        case YYSYMBOL_sinsn:
          yyloc.file = (char *)easm_expr_bin(EASM_EXPR_MOD,*(easm_expr **)(yylsa[199].file + -0x20),
                                             *(easm_expr **)yylsa[199].file);
          (((easm_expr *)yyloc.file)->loc).lstart = (int)yyerror_range[2].file;
          (((easm_expr *)yyloc.file)->loc).cstart = yyerror_range[2].file._4_4_;
          (((easm_expr *)yyloc.file)->loc).lend = yyloc.lstart;
          (((easm_expr *)yyloc.file)->loc).cend = yyloc.cstart;
          (((easm_expr *)yyloc.file)->loc).file = (char *)yyloc._8_8_;
          break;
        case YYSYMBOL_operand:
          yyloc.file = (char *)easm_expr_un(EASM_EXPR_NEG,*(easm_expr **)yylsa[199].file);
          (((easm_expr *)yyloc.file)->loc).lstart = (int)yyerror_range[2].file;
          (((easm_expr *)yyloc.file)->loc).cstart = yyerror_range[2].file._4_4_;
          (((easm_expr *)yyloc.file)->loc).lend = yyloc.lstart;
          (((easm_expr *)yyloc.file)->loc).cend = yyloc.cstart;
          (((easm_expr *)yyloc.file)->loc).file = (char *)yyloc._8_8_;
          break;
        case YYSYMBOL_mod:
          yyloc.file = (char *)easm_expr_un(EASM_EXPR_NOT,*(easm_expr **)yylsa[199].file);
          (((easm_expr *)yyloc.file)->loc).lstart = (int)yyerror_range[2].file;
          (((easm_expr *)yyloc.file)->loc).cstart = yyerror_range[2].file._4_4_;
          (((easm_expr *)yyloc.file)->loc).lend = yyloc.lstart;
          (((easm_expr *)yyloc.file)->loc).cend = yyloc.cstart;
          (((easm_expr *)yyloc.file)->loc).file = (char *)yyloc._8_8_;
          break;
        case YYSYMBOL_mods:
          yyloc.file = (char *)easm_expr_un(EASM_EXPR_LNOT,*(easm_expr **)yylsa[199].file);
          (((easm_expr *)yyloc.file)->loc).lstart = (int)yyerror_range[2].file;
          (((easm_expr *)yyloc.file)->loc).cstart = yyerror_range[2].file._4_4_;
          (((easm_expr *)yyloc.file)->loc).lend = yyloc.lstart;
          (((easm_expr *)yyloc.file)->loc).cend = yyloc.cstart;
          (((easm_expr *)yyloc.file)->loc).file = (char *)yyloc._8_8_;
          break;
        case YYSYMBOL_expr0:
          yyloc.file = *(char **)(yylsa[199].file + -0x10);
          break;
        case YYSYMBOL_expr1:
          yyloc.file = (char *)easm_expr_num(EASM_EXPR_NUM,*(uint64_t *)yylsa[199].file);
          (((easm_expr *)yyloc.file)->loc).lstart = (int)yyerror_range[2].file;
          (((easm_expr *)yyloc.file)->loc).cstart = yyerror_range[2].file._4_4_;
          (((easm_expr *)yyloc.file)->loc).lend = yyloc.lstart;
          (((easm_expr *)yyloc.file)->loc).cend = yyloc.cstart;
          (((easm_expr *)yyloc.file)->loc).file = (char *)yyloc._8_8_;
          break;
        case YYSYMBOL_expr2:
          yyloc.file = (char *)easm_expr_str(EASM_EXPR_LABEL,*(char **)yylsa[199].file);
          (((easm_expr *)yyloc.file)->loc).lstart = (int)yyerror_range[2].file;
          (((easm_expr *)yyloc.file)->loc).cstart = yyerror_range[2].file._4_4_;
          (((easm_expr *)yyloc.file)->loc).lend = yyloc.lstart;
          (((easm_expr *)yyloc.file)->loc).cend = yyloc.cstart;
          (((easm_expr *)yyloc.file)->loc).file = (char *)yyloc._8_8_;
          break;
        case YYSYMBOL_expr3:
          yyloc.file = (char *)easm_expr_str(EASM_EXPR_REG,*(char **)yylsa[199].file);
          (((easm_expr *)yyloc.file)->loc).lstart = (int)yyerror_range[2].file;
          (((easm_expr *)yyloc.file)->loc).cstart = yyerror_range[2].file._4_4_;
          (((easm_expr *)yyloc.file)->loc).lend = yyloc.lstart;
          (((easm_expr *)yyloc.file)->loc).cend = yyloc.cstart;
          (((easm_expr *)yyloc.file)->loc).file = (char *)yyloc._8_8_;
          break;
        case YYSYMBOL_expr4:
          yyloc.file = *(char **)(yylsa[199].file + -0x10);
          *(ulong *)(yyloc.file + 0x60) =
               CONCAT44(yyerror_range[2].file._4_4_,(int)yyerror_range[2].file);
          *(ulong *)(yyloc.file + 0x68) = CONCAT44(yyloc.cstart,yyloc.lstart);
          *(undefined8 *)(yyloc.file + 0x70) = yyloc._8_8_;
          break;
        case YYSYMBOL_expr5:
          yyloc.file = *(char **)(yylsa[199].file + -0x10);
          *(undefined8 *)(yyloc.file + 0x40) = *(undefined8 *)(yylsa[199].file + -0x20);
          *(ulong *)(yyloc.file + 0x60) =
               CONCAT44(yyerror_range[2].file._4_4_,(int)yyerror_range[2].file);
          *(ulong *)(yyloc.file + 0x68) = CONCAT44(yyloc.cstart,yyloc.lstart);
          *(undefined8 *)(yyloc.file + 0x70) = yyloc._8_8_;
          break;
        case YYSYMBOL_sexpr:
          yyloc.file = (char *)easm_expr_un(EASM_EXPR_SWIZZLE,
                                            *(easm_expr **)(yylsa[199].file + -0x10));
          if (((easm_expr *)yyloc.file)->swizzlesmax <= ((easm_expr *)yyloc.file)->swizzlesnum) {
            if (((easm_expr *)yyloc.file)->swizzlesmax == 0) {
              ((easm_expr *)yyloc.file)->swizzlesmax = 0x10;
            }
            else {
              ((easm_expr *)yyloc.file)->swizzlesmax = ((easm_expr *)yyloc.file)->swizzlesmax << 1;
            }
            peVar9 = (easm_swizzle *)
                     realloc(((easm_expr *)yyloc.file)->swizzles,
                             (long)((easm_expr *)yyloc.file)->swizzlesmax << 4);
            ((easm_expr *)yyloc.file)->swizzles = peVar9;
          }
          peVar9 = ((easm_expr *)yyloc.file)->swizzles;
          iVar6 = ((easm_expr *)yyloc.file)->swizzlesnum;
          ((easm_expr *)yyloc.file)->swizzlesnum = iVar6 + 1;
          peVar9[iVar6].str = *(char **)yylsa[199].file;
          peVar9[iVar6].num = 0;
          (((easm_expr *)yyloc.file)->loc).lstart = (int)yyerror_range[2].file;
          (((easm_expr *)yyloc.file)->loc).cstart = yyerror_range[2].file._4_4_;
          (((easm_expr *)yyloc.file)->loc).lend = yyloc.lstart;
          (((easm_expr *)yyloc.file)->loc).cend = yyloc.cstart;
          (((easm_expr *)yyloc.file)->loc).file = (char *)yyloc._8_8_;
          break;
        case YYSYMBOL_sexpr0:
          yyloc.file = (char *)easm_expr_un(EASM_EXPR_SWIZZLE,
                                            *(easm_expr **)(yylsa[199].file + -0x10));
          if (((easm_expr *)yyloc.file)->swizzlesmax <= ((easm_expr *)yyloc.file)->swizzlesnum) {
            if (((easm_expr *)yyloc.file)->swizzlesmax == 0) {
              ((easm_expr *)yyloc.file)->swizzlesmax = 0x10;
            }
            else {
              ((easm_expr *)yyloc.file)->swizzlesmax = ((easm_expr *)yyloc.file)->swizzlesmax << 1;
            }
            peVar9 = (easm_swizzle *)
                     realloc(((easm_expr *)yyloc.file)->swizzles,
                             (long)((easm_expr *)yyloc.file)->swizzlesmax << 4);
            ((easm_expr *)yyloc.file)->swizzles = peVar9;
          }
          peVar9 = ((easm_expr *)yyloc.file)->swizzles;
          iVar6 = ((easm_expr *)yyloc.file)->swizzlesnum;
          ((easm_expr *)yyloc.file)->swizzlesnum = iVar6 + 1;
          uVar3 = *(uint64_t *)yylsa[199].file;
          peVar9[iVar6].str = (char *)0x0;
          peVar9[iVar6].num = uVar3;
          (((easm_expr *)yyloc.file)->loc).lstart = (int)yyerror_range[2].file;
          (((easm_expr *)yyloc.file)->loc).cstart = yyerror_range[2].file._4_4_;
          (((easm_expr *)yyloc.file)->loc).lend = yyloc.lstart;
          (((easm_expr *)yyloc.file)->loc).cend = yyloc.cstart;
          (((easm_expr *)yyloc.file)->loc).file = (char *)yyloc._8_8_;
          break;
        case YYSYMBOL_sexpr1:
          yyloc.file = *(char **)(yylsa[199].file + -0x10);
          *(ulong *)(yyloc.file + 0x60) =
               CONCAT44(yyerror_range[2].file._4_4_,(int)yyerror_range[2].file);
          *(ulong *)(yyloc.file + 0x68) = CONCAT44(yyloc.cstart,yyloc.lstart);
          *(undefined8 *)(yyloc.file + 0x70) = yyloc._8_8_;
          break;
        case YYSYMBOL_pexpr:
          yyloc.file = (char *)easm_expr_sinsn(*(easm_sinsn **)(yylsa[199].file + -0x10));
          (((easm_expr *)yyloc.file)->loc).lstart = (int)yyerror_range[2].file;
          (((easm_expr *)yyloc.file)->loc).cstart = yyerror_range[2].file._4_4_;
          (((easm_expr *)yyloc.file)->loc).lend = yyloc.lstart;
          (((easm_expr *)yyloc.file)->loc).cend = yyloc.cstart;
          (((easm_expr *)yyloc.file)->loc).file = (char *)yyloc._8_8_;
          break;
        case YYSYMBOL_aexpr:
          yyloc.file = (char *)easm_expr_simple(EASM_EXPR_DISCARD);
          (((easm_expr *)yyloc.file)->loc).lstart = (int)yyerror_range[2].file;
          (((easm_expr *)yyloc.file)->loc).cstart = yyerror_range[2].file._4_4_;
          (((easm_expr *)yyloc.file)->loc).lend = yyloc.lstart;
          (((easm_expr *)yyloc.file)->loc).cend = yyloc.cstart;
          (((easm_expr *)yyloc.file)->loc).file = (char *)yyloc._8_8_;
          break;
        case YYSYMBOL_lswizzle:
          yyloc.file = (char *)easm_expr_simple(EASM_EXPR_ZVEC);
          (((easm_expr *)yyloc.file)->loc).lstart = (int)yyerror_range[2].file;
          (((easm_expr *)yyloc.file)->loc).cstart = yyerror_range[2].file._4_4_;
          (((easm_expr *)yyloc.file)->loc).lend = yyloc.lstart;
          (((easm_expr *)yyloc.file)->loc).cend = yyloc.cstart;
          (((easm_expr *)yyloc.file)->loc).file = (char *)yyloc._8_8_;
          break;
        case YYSYMBOL_membody:
          yyloc.file = (char *)easm_expr_astr(*(astr *)yylsa[199].file);
          (((easm_expr *)yyloc.file)->loc).lstart = (int)yyerror_range[2].file;
          (((easm_expr *)yyloc.file)->loc).cstart = yyerror_range[2].file._4_4_;
          (((easm_expr *)yyloc.file)->loc).lend = yyloc.lstart;
          (((easm_expr *)yyloc.file)->loc).cend = yyloc.cstart;
          (((easm_expr *)yyloc.file)->loc).file = (char *)yyloc._8_8_;
          break;
        case YYSYMBOL_membody|YYSYMBOL_YYerror:
          yyloc.file = (char *)easm_expr_un(EASM_EXPR_SWIZZLE,
                                            *(easm_expr **)(yylsa[199].file + -0x10));
          break;
        case YYSYMBOL_membody|YYSYMBOL_YYUNDEF:
          yyloc.file = *(char **)(yylsa[199].file + -0x10);
          if (*(int *)(yyloc.file + 0x2c) <= *(int *)(yyloc.file + 0x28)) {
            if (*(int *)(yyloc.file + 0x2c) == 0) {
              yyloc.file[0x2c] = '\x10';
              yyloc.file[0x2d] = '\0';
              yyloc.file[0x2e] = '\0';
              yyloc.file[0x2f] = '\0';
            }
            else {
              *(int *)(yyloc.file + 0x2c) = *(int *)(yyloc.file + 0x2c) << 1;
            }
            pvVar10 = realloc(*(void **)(yyloc.file + 0x20),(long)*(int *)(yyloc.file + 0x2c) << 4);
            *(void **)(yyloc.file + 0x20) = pvVar10;
          }
          iVar6 = *(int *)(yyloc.file + 0x28);
          *(int *)(yyloc.file + 0x28) = iVar6 + 1;
          puVar11 = (undefined8 *)(*(long *)(yyloc.file + 0x20) + (long)iVar6 * 0x10);
          *puVar11 = *(undefined8 *)yylsa[199].file;
          puVar11[1] = 0;
          break;
        case YYSYMBOL_membody|YYSYMBOL_T_SHL:
          yyloc.file = *(char **)(yylsa[199].file + -0x10);
          if (*(int *)(yyloc.file + 0x2c) <= *(int *)(yyloc.file + 0x28)) {
            if (*(int *)(yyloc.file + 0x2c) == 0) {
              yyloc.file[0x2c] = '\x10';
              yyloc.file[0x2d] = '\0';
              yyloc.file[0x2e] = '\0';
              yyloc.file[0x2f] = '\0';
            }
            else {
              *(int *)(yyloc.file + 0x2c) = *(int *)(yyloc.file + 0x2c) << 1;
            }
            pvVar10 = realloc(*(void **)(yyloc.file + 0x20),(long)*(int *)(yyloc.file + 0x2c) << 4);
            *(void **)(yyloc.file + 0x20) = pvVar10;
          }
          iVar6 = *(int *)(yyloc.file + 0x28);
          *(int *)(yyloc.file + 0x28) = iVar6 + 1;
          puVar11 = (undefined8 *)(*(long *)(yyloc.file + 0x20) + (long)iVar6 * 0x10);
          uVar4 = *(undefined8 *)yylsa[199].file;
          *puVar11 = 0;
          puVar11[1] = uVar4;
          break;
        case YYSYMBOL_sexpr1|YYSYMBOL_T_PLUSPLUS:
          yyloc.file = (char *)easm_expr_un(EASM_EXPR_MEM,*(easm_expr **)yylsa[199].file);
          ((easm_expr *)yyloc.file)->mods = *(easm_mods **)(yylsa[199].file + -0x10);
          break;
        case YYSYMBOL_sexpr1|YYSYMBOL_T_MINUSMINUS:
          yyloc.file = (char *)easm_expr_bin(EASM_EXPR_MEMPP,
                                             *(easm_expr **)(yylsa[199].file + -0x20),
                                             *(easm_expr **)yylsa[199].file);
          ((easm_expr *)yyloc.file)->mods = *(easm_mods **)(yylsa[199].file + -0x30);
          break;
        case YYSYMBOL_sexpr1|YYSYMBOL_T_PLUSEQ:
          yyloc.file = (char *)easm_expr_bin(EASM_EXPR_MEMMM,
                                             *(easm_expr **)(yylsa[199].file + -0x20),
                                             *(easm_expr **)yylsa[199].file);
          ((easm_expr *)yyloc.file)->mods = *(easm_mods **)(yylsa[199].file + -0x30);
          break;
        case YYSYMBOL_sexpr1|YYSYMBOL_T_MINUSEQ:
          yyloc.file = (char *)easm_expr_bin(EASM_EXPR_MEMPE,
                                             *(easm_expr **)(yylsa[199].file + -0x20),
                                             *(easm_expr **)yylsa[199].file);
          ((easm_expr *)yyloc.file)->mods = *(easm_mods **)(yylsa[199].file + -0x30);
          break;
        case YYSYMBOL_sexpr1|YYSYMBOL_T_DOTLP:
          yyloc.file = (char *)easm_expr_bin(EASM_EXPR_MEMME,
                                             *(easm_expr **)(yylsa[199].file + -0x20),
                                             *(easm_expr **)yylsa[199].file);
          ((easm_expr *)yyloc.file)->mods = *(easm_mods **)(yylsa[199].file + -0x30);
        }
        yyvsa[199]._8_8_ = yyvsa[199].astr.len - (long)iVar7;
        *(char **)(yylsa[199].file + (long)iVar7 * -0x10 + 0x10) = yyloc.file;
        *(undefined8 *)(yylsa[199].file + (long)iVar7 * -0x10 + 0x18) = uVar2;
        *(envy_loc **)(_yyresult + (1 - (long)iVar7)) =
             (envy_loc *)CONCAT44(yyerror_range[2].file._4_4_,(int)yyerror_range[2].file);
        _yyresult[1 - (long)iVar7].lend = yyloc.lstart;
        _yyresult[1 - (long)iVar7].cend = yyloc.cstart;
        _yyresult[1 - (long)iVar7].file = (char *)yyloc._8_8_;
        iVar6 = (int)yypgoto[""[yytoken] + -0x29] + (int)*(char *)yyvsa[199]._8_8_;
        if (((iVar6 < 0) || (0x97 < iVar6)) ||
           ("\x16;<\'\x1b\r\x0e\x0e"[iVar6] != *(char *)yyvsa[199]._8_8_)) {
          cVar1 = ""[""[yytoken] + -0x29];
        }
        else {
          cVar1 = yytable[iVar6];
        }
        local_21ac = (int)cVar1;
        local_50 = local_21ac;
        _yyresult = _yyresult + (1 - (long)iVar7);
        yylsa[199].file = yylsa[199].file + (long)iVar7 * -0x10 + 0x10;
      }
    }
    else {
      if (yylval.astr.len._4_4_ == -2) {
        yylval.astr.len._4_4_ = easm_lex((YYSTYPE *)&yylloc.file,(envy_loc *)&yystate,lex_state);
      }
      if (0 < (int)yylval.astr.len._4_4_) {
        if (yylval.astr.len._4_4_ != 0x100) {
          if (((int)yylval.astr.len._4_4_ < 0) || (0x115 < (int)yylval.astr.len._4_4_)) {
            local_219c = 2;
          }
          else {
            local_219c = (int)""[(int)yylval.astr.len._4_4_];
          }
          yyval.astr.len._4_4_ = local_219c;
          goto LAB_0024f630;
        }
        yylval.astr.len._4_4_ = 0x101;
        yyerror_range[0].file = (char *)_yystate;
        yyerror_range[1].lend = yylloc.lend;
        yyerror_range[1].cend = yylloc.cend;
        goto LAB_00251520;
      }
      yylval.astr.len._4_4_ = 0;
      yyval.astr.len._4_4_ = 0;
LAB_0024f630:
      iVar7 = yyval.astr.len._4_4_ + (int)cVar1;
      if (((iVar7 < 0) || (0x97 < iVar7)) ||
         ((int)"\x16;<\'\x1b\r\x0e\x0e"[iVar7] != yyval.astr.len._4_4_)) goto LAB_0024f721;
      local_50 = (int)yytable[iVar7];
      if (local_50 < 1) {
        yytoken = -local_50;
        goto LAB_0024f746;
      }
      if (yystacksize._4_4_ != 0) {
        yystacksize._4_4_ = yystacksize._4_4_ + -1;
      }
      *(char **)(yylsa[199].file + 0x10) = yylloc.file;
      *(undefined8 *)(yylsa[199].file + 0x18) = uVar5;
      *(envy_loc **)(_yyresult + 1) = _yystate;
      _yyresult[1].lend = yylloc.lstart;
      _yyresult[1].cend = yylloc.cstart;
      _yyresult[1].file = (char *)yylloc._8_8_;
      yylval.astr.len._4_4_ = 0xfffffffe;
      _yyresult = _yyresult + 1;
      yylsa[199].file = yylsa[199].file + 0x10;
    }
  }
  lVar8 = yyvsa[199].astr.len - (long)yyssp;
  __n = lVar8 + 1;
  if ((long)yyssa._192_8_ < 10000) {
    yyssa._192_8_ = yyssa._192_8_ << 1;
    if (10000 < (long)yyssa._192_8_) {
      yyssa[0xc0] = '\x10';
      yyssa[0xc1] = '\'';
      yyssa[0xc2] = '\0';
      yyssa[0xc3] = '\0';
      yyssa[0xc4] = '\0';
      yyssa[0xc5] = '\0';
      yyssa[0xc6] = '\0';
      yyssa[199] = '\0';
    }
    __dest = (yy_state_t *)malloc(yyssa._192_8_ * 0x29 + 0x2e);
    if (__dest != (yy_state_t *)0x0) {
      memcpy(__dest,yyssp,__n);
      __dest_00 = (YYSTYPE *)(__dest + ((yyssa._192_8_ + 0x17) / 0x18) * 0x18);
      memcpy(__dest_00,yyvsp,__n * 0x10);
      __dest_01 = (envy_loc *)(((yyssa._192_8_ * 0x10 + 0x17) / 0x18) * 0x18 + (long)__dest_00);
      memcpy(__dest_01,yylsp,__n * 0x18);
      if ((yy_state_t **)yyssp != &yyss) {
        free(yyssp);
      }
      yyvsa[199]._8_8_ = __dest + lVar8;
      yylsa[199].file = (char *)(__dest_00 + lVar8);
      _yyresult = __dest_01 + lVar8;
      yylsp = __dest_01;
      yyvsp = __dest_00;
      yyssp = __dest;
      if ((ulong)yyvsa[199]._8_8_ < __dest + yyssa._192_8_ + -1) goto LAB_0024f548;
LAB_00251724:
      local_20a0 = 1;
LAB_00251752:
      if (yylval.astr.len._4_4_ != -2) {
        if (((int)yylval.astr.len._4_4_ < 0) || (0x115 < (int)yylval.astr.len._4_4_)) {
          local_21b8 = YYSYMBOL_YYUNDEF;
        }
        else {
          local_21b8 = (yysymbol_kind_t)""[(int)yylval.astr.len._4_4_];
        }
        yydestruct("Cleanup: discarding lookahead",local_21b8,(YYSTYPE *)&yylloc.file,
                   (envy_loc *)&yystate,lex_state,res);
      }
      for (; (yy_state_t *)yyvsa[199]._8_8_ != yyssp; yyvsa[199]._8_8_ = yyvsa[199].astr.len - 1) {
        yydestruct("Cleanup: popping",(int)""[(int)*(char *)yyvsa[199]._8_8_],
                   (YYSTYPE *)yylsa[199].file,_yyresult,lex_state,res);
        yylsa[199].file = yylsa[199].file + -0x10;
        _yyresult = _yyresult + -1;
      }
      if ((yy_state_t **)yyssp != &yyss) {
        free(yyssp);
      }
      return local_20a0;
    }
  }
  easm_error((envy_loc *)&yystate,lex_state,res,"memory exhausted");
  local_20a0 = 2;
  goto LAB_00251752;
}

Assistant:

int
yyparse (void *lex_state, struct easm_file **res)
{
/* Lookahead token kind.  */
int yychar;


/* The semantic value of the lookahead symbol.  */
/* Default value used for initialization, for pacifying older GCCs
   or non-GCC compilers.  */
YY_INITIAL_VALUE (static YYSTYPE yyval_default;)
YYSTYPE yylval YY_INITIAL_VALUE (= yyval_default);

/* Location data for the lookahead symbol.  */
static YYLTYPE yyloc_default
# if defined YYLTYPE_IS_TRIVIAL && YYLTYPE_IS_TRIVIAL
  = { 1, 1, 1, 1 }
# endif
;
YYLTYPE yylloc = yyloc_default;

    /* Number of syntax errors so far.  */
    int yynerrs = 0;

    yy_state_fast_t yystate = 0;
    /* Number of tokens to shift before error messages enabled.  */
    int yyerrstatus = 0;

    /* Refer to the stacks through separate pointers, to allow yyoverflow
       to reallocate them elsewhere.  */

    /* Their size.  */
    YYPTRDIFF_T yystacksize = YYINITDEPTH;

    /* The state stack: array, bottom, top.  */
    yy_state_t yyssa[YYINITDEPTH];
    yy_state_t *yyss = yyssa;
    yy_state_t *yyssp = yyss;

    /* The semantic value stack: array, bottom, top.  */
    YYSTYPE yyvsa[YYINITDEPTH];
    YYSTYPE *yyvs = yyvsa;
    YYSTYPE *yyvsp = yyvs;

    /* The location stack: array, bottom, top.  */
    YYLTYPE yylsa[YYINITDEPTH];
    YYLTYPE *yyls = yylsa;
    YYLTYPE *yylsp = yyls;

  int yyn;
  /* The return value of yyparse.  */
  int yyresult;
  /* Lookahead symbol kind.  */
  yysymbol_kind_t yytoken = YYSYMBOL_YYEMPTY;
  /* The variables used to return semantic value and location from the
     action routines.  */
  YYSTYPE yyval;
  YYLTYPE yyloc;

  /* The locations where the error started and ended.  */
  YYLTYPE yyerror_range[3];



#define YYPOPSTACK(N)   (yyvsp -= (N), yyssp -= (N), yylsp -= (N))

  /* The number of symbols on the RHS of the reduced rule.
     Keep to zero when no symbol should be popped.  */
  int yylen = 0;

  YYDPRINTF ((stderr, "Starting parse\n"));

  yychar = YYEMPTY; /* Cause a token to be read.  */

  yylsp[0] = yylloc;
  goto yysetstate;


/*------------------------------------------------------------.
| yynewstate -- push a new state, which is found in yystate.  |
`------------------------------------------------------------*/
yynewstate:
  /* In all cases, when you get here, the value and location stacks
     have just been pushed.  So pushing a state here evens the stacks.  */
  yyssp++;


/*--------------------------------------------------------------------.
| yysetstate -- set current state (the top of the stack) to yystate.  |
`--------------------------------------------------------------------*/
yysetstate:
  YYDPRINTF ((stderr, "Entering state %d\n", yystate));
  YY_ASSERT (0 <= yystate && yystate < YYNSTATES);
  YY_IGNORE_USELESS_CAST_BEGIN
  *yyssp = YY_CAST (yy_state_t, yystate);
  YY_IGNORE_USELESS_CAST_END
  YY_STACK_PRINT (yyss, yyssp);

  if (yyss + yystacksize - 1 <= yyssp)
#if !defined yyoverflow && !defined YYSTACK_RELOCATE
    YYNOMEM;
#else
    {
      /* Get the current used size of the three stacks, in elements.  */
      YYPTRDIFF_T yysize = yyssp - yyss + 1;

# if defined yyoverflow
      {
        /* Give user a chance to reallocate the stack.  Use copies of
           these so that the &'s don't force the real ones into
           memory.  */
        yy_state_t *yyss1 = yyss;
        YYSTYPE *yyvs1 = yyvs;
        YYLTYPE *yyls1 = yyls;

        /* Each stack pointer address is followed by the size of the
           data in use in that stack, in bytes.  This used to be a
           conditional around just the two extra args, but that might
           be undefined if yyoverflow is a macro.  */
        yyoverflow (YY_("memory exhausted"),
                    &yyss1, yysize * YYSIZEOF (*yyssp),
                    &yyvs1, yysize * YYSIZEOF (*yyvsp),
                    &yyls1, yysize * YYSIZEOF (*yylsp),
                    &yystacksize);
        yyss = yyss1;
        yyvs = yyvs1;
        yyls = yyls1;
      }
# else /* defined YYSTACK_RELOCATE */
      /* Extend the stack our own way.  */
      if (YYMAXDEPTH <= yystacksize)
        YYNOMEM;
      yystacksize *= 2;
      if (YYMAXDEPTH < yystacksize)
        yystacksize = YYMAXDEPTH;

      {
        yy_state_t *yyss1 = yyss;
        union yyalloc *yyptr =
          YY_CAST (union yyalloc *,
                   YYSTACK_ALLOC (YY_CAST (YYSIZE_T, YYSTACK_BYTES (yystacksize))));
        if (! yyptr)
          YYNOMEM;
        YYSTACK_RELOCATE (yyss_alloc, yyss);
        YYSTACK_RELOCATE (yyvs_alloc, yyvs);
        YYSTACK_RELOCATE (yyls_alloc, yyls);
#  undef YYSTACK_RELOCATE
        if (yyss1 != yyssa)
          YYSTACK_FREE (yyss1);
      }
# endif

      yyssp = yyss + yysize - 1;
      yyvsp = yyvs + yysize - 1;
      yylsp = yyls + yysize - 1;

      YY_IGNORE_USELESS_CAST_BEGIN
      YYDPRINTF ((stderr, "Stack size increased to %ld\n",
                  YY_CAST (long, yystacksize)));
      YY_IGNORE_USELESS_CAST_END

      if (yyss + yystacksize - 1 <= yyssp)
        YYABORT;
    }
#endif /* !defined yyoverflow && !defined YYSTACK_RELOCATE */


  if (yystate == YYFINAL)
    YYACCEPT;

  goto yybackup;


/*-----------.
| yybackup.  |
`-----------*/
yybackup:
  /* Do appropriate processing given the current state.  Read a
     lookahead token if we need one and don't already have one.  */

  /* First try to decide what to do without reference to lookahead token.  */
  yyn = yypact[yystate];
  if (yypact_value_is_default (yyn))
    goto yydefault;

  /* Not known => get a lookahead token if don't already have one.  */

  /* YYCHAR is either empty, or end-of-input, or a valid lookahead.  */
  if (yychar == YYEMPTY)
    {
      YYDPRINTF ((stderr, "Reading a token\n"));
      yychar = yylex (&yylval, &yylloc, lex_state);
    }

  if (yychar <= YYEOF)
    {
      yychar = YYEOF;
      yytoken = YYSYMBOL_YYEOF;
      YYDPRINTF ((stderr, "Now at end of input.\n"));
    }
  else if (yychar == YYerror)
    {
      /* The scanner already issued an error message, process directly
         to error recovery.  But do not keep the error token as
         lookahead, it is too special and may lead us to an endless
         loop in error recovery. */
      yychar = YYUNDEF;
      yytoken = YYSYMBOL_YYerror;
      yyerror_range[1] = yylloc;
      goto yyerrlab1;
    }
  else
    {
      yytoken = YYTRANSLATE (yychar);
      YY_SYMBOL_PRINT ("Next token is", yytoken, &yylval, &yylloc);
    }

  /* If the proper action on seeing token YYTOKEN is to reduce or to
     detect an error, take that action.  */
  yyn += yytoken;
  if (yyn < 0 || YYLAST < yyn || yycheck[yyn] != yytoken)
    goto yydefault;
  yyn = yytable[yyn];
  if (yyn <= 0)
    {
      if (yytable_value_is_error (yyn))
        goto yyerrlab;
      yyn = -yyn;
      goto yyreduce;
    }

  /* Count tokens shifted since error; after three, turn off error
     status.  */
  if (yyerrstatus)
    yyerrstatus--;

  /* Shift the lookahead token.  */
  YY_SYMBOL_PRINT ("Shifting", yytoken, &yylval, &yylloc);
  yystate = yyn;
  YY_IGNORE_MAYBE_UNINITIALIZED_BEGIN
  *++yyvsp = yylval;
  YY_IGNORE_MAYBE_UNINITIALIZED_END
  *++yylsp = yylloc;

  /* Discard the shifted token.  */
  yychar = YYEMPTY;
  goto yynewstate;


/*-----------------------------------------------------------.
| yydefault -- do the default action for the current state.  |
`-----------------------------------------------------------*/
yydefault:
  yyn = yydefact[yystate];
  if (yyn == 0)
    goto yyerrlab;
  goto yyreduce;


/*-----------------------------.
| yyreduce -- do a reduction.  |
`-----------------------------*/
yyreduce:
  /* yyn is the number of a rule to reduce with.  */
  yylen = yyr2[yyn];

  /* If YYLEN is nonzero, implement the default value of the action:
     '$$ = $1'.

     Otherwise, the following line sets YYVAL to garbage.
     This behavior is undocumented and Bison
     users should not rely upon it.  Assigning to YYVAL
     unconditionally makes the parser a bit smaller, and it avoids a
     GCC warning that YYVAL may be used uninitialized.  */
  yyval = yyvsp[1-yylen];

  /* Default location. */
  YYLLOC_DEFAULT (yyloc, (yylsp - yylen), yylen);
  yyerror_range[1] = yyloc;
  YY_REDUCE_PRINT (yyn);
  switch (yyn)
    {
  case 2: /* start: file  */
#line 111 "easm_parse.y"
                        { *res = (yyvsp[0].file); }
#line 1561 "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/build_O0/easm/easm_parse.c"
    break;

  case 3: /* file: file line  */
#line 113 "easm_parse.y"
                        { (yyval.file) = (yyvsp[-1].file); if ((yyvsp[0].line)) ADDARRAY((yyval.file)->lines, (yyvsp[0].line)); }
#line 1567 "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/build_O0/easm/easm_parse.c"
    break;

  case 4: /* file: %empty  */
#line 114 "easm_parse.y"
                        { (yyval.file) = calloc(sizeof *(yyval.file), 1); }
#line 1573 "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/build_O0/easm/easm_parse.c"
    break;

  case 5: /* line: direct eol  */
#line 116 "easm_parse.y"
                        { (yyval.line) = calloc(sizeof *(yyval.line), 1); (yyval.line)->loc = (yyloc); (yyval.line)->type = EASM_LINE_DIRECTIVE; (yyval.line)->directive = (yyvsp[-1].direct); }
#line 1579 "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/build_O0/easm/easm_parse.c"
    break;

  case 6: /* line: insn eol  */
#line 117 "easm_parse.y"
                        { (yyval.line) = calloc(sizeof *(yyval.line), 1); (yyval.line)->loc = (yyloc); (yyval.line)->type = EASM_LINE_INSN; (yyval.line)->insn = (yyvsp[-1].insn); }
#line 1585 "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/build_O0/easm/easm_parse.c"
    break;

  case 7: /* line: T_WORDC  */
#line 118 "easm_parse.y"
                        { (yyval.line) = calloc(sizeof *(yyval.line), 1); (yyval.line)->loc = (yyloc); (yyval.line)->type = EASM_LINE_LABEL; (yyval.line)->lname = (yyvsp[0].str); }
#line 1591 "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/build_O0/easm/easm_parse.c"
    break;

  case 8: /* line: eol  */
#line 119 "easm_parse.y"
                        { (yyval.line) = 0; }
#line 1597 "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/build_O0/easm/easm_parse.c"
    break;

  case 11: /* direct: T_DOTWORD  */
#line 124 "easm_parse.y"
                        { (yyval.direct) = calloc(sizeof *(yyval.direct), 1); (yyval.direct)->loc = (yyloc); (yyval.direct)->str = (yyvsp[0].str); }
#line 1603 "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/build_O0/easm/easm_parse.c"
    break;

  case 12: /* direct: direct expr  */
#line 125 "easm_parse.y"
                        { (yyval.direct) = (yyvsp[-1].direct); (yyval.direct)->loc = (yyloc); ADDARRAY((yyval.direct)->params, (yyvsp[0].expr)); }
#line 1609 "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/build_O0/easm/easm_parse.c"
    break;

  case 13: /* insn: subinsn  */
#line 127 "easm_parse.y"
                                { (yyval.insn) = calloc(sizeof *(yyval.insn), 1); (yyval.insn)->loc = (yyloc); ADDARRAY((yyval.insn)->subinsns, (yyvsp[0].subinsn)); }
#line 1615 "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/build_O0/easm/easm_parse.c"
    break;

  case 14: /* insn: insn '&' subinsn  */
#line 128 "easm_parse.y"
                                { (yyval.insn) = (yyvsp[-2].insn); (yyval.insn)->loc = (yyloc); ADDARRAY((yyval.insn)->subinsns, (yyvsp[0].subinsn)); }
#line 1621 "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/build_O0/easm/easm_parse.c"
    break;

  case 15: /* insn: insn '\n' '&' subinsn  */
#line 129 "easm_parse.y"
                                { (yyval.insn) = (yyvsp[-3].insn); (yyval.insn)->loc = (yyloc); ADDARRAY((yyval.insn)->subinsns, (yyvsp[0].subinsn)); }
#line 1627 "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/build_O0/easm/easm_parse.c"
    break;

  case 16: /* insn: insn '&' '\n' subinsn  */
#line 130 "easm_parse.y"
                                { (yyval.insn) = (yyvsp[-3].insn); (yyval.insn)->loc = (yyloc); ADDARRAY((yyval.insn)->subinsns, (yyvsp[0].subinsn)); }
#line 1633 "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/build_O0/easm/easm_parse.c"
    break;

  case 17: /* subinsn: prefs sinsn  */
#line 132 "easm_parse.y"
                                { (yyval.subinsn) = (yyvsp[-1].subinsn); (yyval.subinsn)->loc = (yyloc); (yyval.subinsn)->sinsn = (yyvsp[0].sinsn); }
#line 1639 "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/build_O0/easm/easm_parse.c"
    break;

  case 18: /* prefs: prefs pexpr  */
#line 134 "easm_parse.y"
                                { (yyval.subinsn) = (yyvsp[-1].subinsn); ADDARRAY((yyval.subinsn)->prefs, (yyvsp[0].expr)); }
#line 1645 "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/build_O0/easm/easm_parse.c"
    break;

  case 19: /* prefs: %empty  */
#line 135 "easm_parse.y"
                                { (yyval.subinsn) = calloc(sizeof *(yyval.subinsn), 1); }
#line 1651 "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/build_O0/easm/easm_parse.c"
    break;

  case 20: /* sinsn: T_WORD operands mods  */
#line 137 "easm_parse.y"
                                { (yyval.sinsn) = (yyvsp[-1].sinsn); (yyval.sinsn)->loc = (yyloc); (yyval.sinsn)->str = (yyvsp[-2].str); (yyval.sinsn)->mods = (yyvsp[0].mods); }
#line 1657 "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/build_O0/easm/easm_parse.c"
    break;

  case 21: /* operands: operands operand  */
#line 139 "easm_parse.y"
                                        { (yyval.sinsn) = (yyvsp[-1].sinsn); ADDARRAY((yyval.sinsn)->operands, (yyvsp[0].operand)); }
#line 1663 "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/build_O0/easm/easm_parse.c"
    break;

  case 22: /* operands: %empty  */
#line 140 "easm_parse.y"
                                { (yyval.sinsn) = calloc(sizeof *(yyval.sinsn), 1); }
#line 1669 "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/build_O0/easm/easm_parse.c"
    break;

  case 23: /* operand: mods sexpr  */
#line 142 "easm_parse.y"
                                { (yyval.operand) = calloc(sizeof *(yyval.operand), 1); (yyval.operand)->loc = (yyloc); (yyval.operand)->mods = (yyvsp[-1].mods); ADDARRAY((yyval.operand)->exprs, (yyvsp[0].expr)); }
#line 1675 "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/build_O0/easm/easm_parse.c"
    break;

  case 24: /* operand: operand '|' sexpr  */
#line 143 "easm_parse.y"
                                        { (yyval.operand) = (yyvsp[-2].operand); (yyval.operand)->loc = (yyloc); ADDARRAY((yyval.operand)->exprs, (yyvsp[0].expr)); }
#line 1681 "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/build_O0/easm/easm_parse.c"
    break;

  case 25: /* mod: T_WORD  */
#line 145 "easm_parse.y"
                                { (yyval.mod) = calloc(sizeof *(yyval.mod), 1); (yyval.mod)->str = (yyvsp[0].str); (yyval.mod)->loc = (yyloc); }
#line 1687 "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/build_O0/easm/easm_parse.c"
    break;

  case 26: /* mods: mods mod  */
#line 147 "easm_parse.y"
                                { (yyval.mods) = (yyvsp[-1].mods); ADDARRAY((yyval.mods)->mods, (yyvsp[0].mod)); (yyval.mods)->loc = (yyloc); }
#line 1693 "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/build_O0/easm/easm_parse.c"
    break;

  case 27: /* mods: %empty  */
#line 148 "easm_parse.y"
                                { (yyval.mods) = calloc(sizeof *(yyval.mods), 1); (yyval.mods)->loc = (yyloc); }
#line 1699 "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/build_O0/easm/easm_parse.c"
    break;

  case 28: /* expr: expr ':' expr0  */
#line 150 "easm_parse.y"
                                { (yyval.expr) = easm_expr_bin(EASM_EXPR_VEC, (yyvsp[-2].expr), (yyvsp[0].expr)); (yyval.expr)->loc = (yyloc); }
#line 1705 "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/build_O0/easm/easm_parse.c"
    break;

  case 30: /* expr0: expr0 T_LOR expr1  */
#line 153 "easm_parse.y"
                                { (yyval.expr) = easm_expr_bin(EASM_EXPR_LOR, (yyvsp[-2].expr), (yyvsp[0].expr)); (yyval.expr)->loc = (yyloc); }
#line 1711 "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/build_O0/easm/easm_parse.c"
    break;

  case 32: /* expr1: expr1 T_LAND expr2  */
#line 156 "easm_parse.y"
                                { (yyval.expr) = easm_expr_bin(EASM_EXPR_LAND, (yyvsp[-2].expr), (yyvsp[0].expr)); (yyval.expr)->loc = (yyloc); }
#line 1717 "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/build_O0/easm/easm_parse.c"
    break;

  case 34: /* expr2: expr2 '|' expr3  */
#line 159 "easm_parse.y"
                                { (yyval.expr) = easm_expr_bin(EASM_EXPR_OR, (yyvsp[-2].expr), (yyvsp[0].expr)); (yyval.expr)->loc = (yyloc); }
#line 1723 "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/build_O0/easm/easm_parse.c"
    break;

  case 36: /* expr3: expr3 '^' expr4  */
#line 162 "easm_parse.y"
                                { (yyval.expr) = easm_expr_bin(EASM_EXPR_XOR, (yyvsp[-2].expr), (yyvsp[0].expr)); (yyval.expr)->loc = (yyloc); }
#line 1729 "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/build_O0/easm/easm_parse.c"
    break;

  case 38: /* expr4: expr4 '&' expr5  */
#line 165 "easm_parse.y"
                                { (yyval.expr) = easm_expr_bin(EASM_EXPR_AND, (yyvsp[-2].expr), (yyvsp[0].expr)); (yyval.expr)->loc = (yyloc); }
#line 1735 "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/build_O0/easm/easm_parse.c"
    break;

  case 40: /* expr5: expr5 T_SHL sexpr0  */
#line 168 "easm_parse.y"
                                { (yyval.expr) = easm_expr_bin(EASM_EXPR_SHL, (yyvsp[-2].expr), (yyvsp[0].expr)); (yyval.expr)->loc = (yyloc); }
#line 1741 "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/build_O0/easm/easm_parse.c"
    break;

  case 41: /* expr5: expr5 T_SHR sexpr0  */
#line 169 "easm_parse.y"
                                { (yyval.expr) = easm_expr_bin(EASM_EXPR_SHR, (yyvsp[-2].expr), (yyvsp[0].expr)); (yyval.expr)->loc = (yyloc); }
#line 1747 "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/build_O0/easm/easm_parse.c"
    break;

  case 43: /* sexpr: sexpr ':' sexpr0  */
#line 172 "easm_parse.y"
                                { (yyval.expr) = easm_expr_bin(EASM_EXPR_VEC, (yyvsp[-2].expr), (yyvsp[0].expr)); (yyval.expr)->loc = (yyloc); }
#line 1753 "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/build_O0/easm/easm_parse.c"
    break;

  case 45: /* sexpr0: sexpr0 '+' sexpr1  */
#line 175 "easm_parse.y"
                                { (yyval.expr) = easm_expr_bin(EASM_EXPR_ADD, (yyvsp[-2].expr), (yyvsp[0].expr)); (yyval.expr)->loc = (yyloc); }
#line 1759 "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/build_O0/easm/easm_parse.c"
    break;

  case 46: /* sexpr0: sexpr0 '-' sexpr1  */
#line 176 "easm_parse.y"
                                { (yyval.expr) = easm_expr_bin(EASM_EXPR_SUB, (yyvsp[-2].expr), (yyvsp[0].expr)); (yyval.expr)->loc = (yyloc); }
#line 1765 "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/build_O0/easm/easm_parse.c"
    break;

  case 48: /* sexpr1: sexpr1 '*' pexpr  */
#line 179 "easm_parse.y"
                                { (yyval.expr) = easm_expr_bin(EASM_EXPR_MUL, (yyvsp[-2].expr), (yyvsp[0].expr)); (yyval.expr)->loc = (yyloc); }
#line 1771 "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/build_O0/easm/easm_parse.c"
    break;

  case 49: /* sexpr1: sexpr1 '/' pexpr  */
#line 180 "easm_parse.y"
                                { (yyval.expr) = easm_expr_bin(EASM_EXPR_DIV, (yyvsp[-2].expr), (yyvsp[0].expr)); (yyval.expr)->loc = (yyloc); }
#line 1777 "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/build_O0/easm/easm_parse.c"
    break;

  case 50: /* sexpr1: sexpr1 '%' pexpr  */
#line 181 "easm_parse.y"
                                { (yyval.expr) = easm_expr_bin(EASM_EXPR_MOD, (yyvsp[-2].expr), (yyvsp[0].expr)); (yyval.expr)->loc = (yyloc); }
#line 1783 "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/build_O0/easm/easm_parse.c"
    break;

  case 52: /* pexpr: T_UMINUS pexpr  */
#line 184 "easm_parse.y"
                                { (yyval.expr) = easm_expr_un(EASM_EXPR_NEG, (yyvsp[0].expr)); (yyval.expr)->loc = (yyloc); }
#line 1789 "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/build_O0/easm/easm_parse.c"
    break;

  case 53: /* pexpr: '~' pexpr  */
#line 185 "easm_parse.y"
                                { (yyval.expr) = easm_expr_un(EASM_EXPR_NOT, (yyvsp[0].expr)); (yyval.expr)->loc = (yyloc); }
#line 1795 "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/build_O0/easm/easm_parse.c"
    break;

  case 54: /* pexpr: '!' pexpr  */
#line 186 "easm_parse.y"
                                { (yyval.expr) = easm_expr_un(EASM_EXPR_LNOT, (yyvsp[0].expr)); (yyval.expr)->loc = (yyloc); }
#line 1801 "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/build_O0/easm/easm_parse.c"
    break;

  case 56: /* aexpr: '(' expr ')'  */
#line 189 "easm_parse.y"
                                { (yyval.expr) = (yyvsp[-1].expr); }
#line 1807 "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/build_O0/easm/easm_parse.c"
    break;

  case 57: /* aexpr: T_NUM  */
#line 190 "easm_parse.y"
                                { (yyval.expr) = easm_expr_num(EASM_EXPR_NUM, (yyvsp[0].num)); (yyval.expr)->loc = (yyloc); }
#line 1813 "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/build_O0/easm/easm_parse.c"
    break;

  case 58: /* aexpr: T_HASHWORD  */
#line 191 "easm_parse.y"
                                { (yyval.expr) = easm_expr_str(EASM_EXPR_LABEL, (yyvsp[0].str)); (yyval.expr)->loc = (yyloc); }
#line 1819 "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/build_O0/easm/easm_parse.c"
    break;

  case 59: /* aexpr: T_DOLWORD  */
#line 192 "easm_parse.y"
                                { (yyval.expr) = easm_expr_str(EASM_EXPR_REG, (yyvsp[0].str)); (yyval.expr)->loc = (yyloc); }
#line 1825 "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/build_O0/easm/easm_parse.c"
    break;

  case 60: /* aexpr: '[' membody ']'  */
#line 193 "easm_parse.y"
                                { (yyval.expr) = (yyvsp[-1].expr); (yyval.expr)->loc = (yyloc); }
#line 1831 "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/build_O0/easm/easm_parse.c"
    break;

  case 61: /* aexpr: T_WORDLB membody ']'  */
#line 194 "easm_parse.y"
                                { (yyval.expr) = (yyvsp[-1].expr); (yyval.expr)->str = (yyvsp[-2].str); (yyval.expr)->loc = (yyloc); }
#line 1837 "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/build_O0/easm/easm_parse.c"
    break;

  case 62: /* aexpr: aexpr T_DOTWORD  */
#line 195 "easm_parse.y"
                                { (yyval.expr) = easm_expr_un(EASM_EXPR_SWIZZLE, (yyvsp[-1].expr)); ADDARRAY((yyval.expr)->swizzles, ((struct easm_swizzle){(yyvsp[0].str), 0})); (yyval.expr)->loc = (yyloc); }
#line 1843 "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/build_O0/easm/easm_parse.c"
    break;

  case 63: /* aexpr: aexpr T_DOTNUM  */
#line 196 "easm_parse.y"
                                { (yyval.expr) = easm_expr_un(EASM_EXPR_SWIZZLE, (yyvsp[-1].expr)); ADDARRAY((yyval.expr)->swizzles, ((struct easm_swizzle){0, (yyvsp[0].num)})); (yyval.expr)->loc = (yyloc); }
#line 1849 "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/build_O0/easm/easm_parse.c"
    break;

  case 64: /* aexpr: lswizzle ')'  */
#line 197 "easm_parse.y"
                                { (yyval.expr) = (yyvsp[-1].expr); (yyval.expr)->loc = (yyloc); }
#line 1855 "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/build_O0/easm/easm_parse.c"
    break;

  case 65: /* aexpr: '(' sinsn ')'  */
#line 198 "easm_parse.y"
                                { (yyval.expr) = easm_expr_sinsn((yyvsp[-1].sinsn)); (yyval.expr)->loc = (yyloc); }
#line 1861 "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/build_O0/easm/easm_parse.c"
    break;

  case 66: /* aexpr: '#'  */
#line 199 "easm_parse.y"
                                { (yyval.expr) = easm_expr_simple(EASM_EXPR_DISCARD); (yyval.expr)->loc = (yyloc); }
#line 1867 "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/build_O0/easm/easm_parse.c"
    break;

  case 67: /* aexpr: '(' ')'  */
#line 200 "easm_parse.y"
                                { (yyval.expr) = easm_expr_simple(EASM_EXPR_ZVEC); (yyval.expr)->loc = (yyloc); }
#line 1873 "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/build_O0/easm/easm_parse.c"
    break;

  case 68: /* aexpr: T_STR  */
#line 201 "easm_parse.y"
                                { (yyval.expr) = easm_expr_astr((yyvsp[0].astr)); (yyval.expr)->loc = (yyloc); }
#line 1879 "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/build_O0/easm/easm_parse.c"
    break;

  case 69: /* lswizzle: aexpr T_DOTLP  */
#line 203 "easm_parse.y"
                                { (yyval.expr) = easm_expr_un(EASM_EXPR_SWIZZLE, (yyvsp[-1].expr)); }
#line 1885 "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/build_O0/easm/easm_parse.c"
    break;

  case 70: /* lswizzle: lswizzle T_WORD  */
#line 204 "easm_parse.y"
                                { (yyval.expr) = (yyvsp[-1].expr); ADDARRAY((yyval.expr)->swizzles, ((struct easm_swizzle){(yyvsp[0].str), 0})); }
#line 1891 "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/build_O0/easm/easm_parse.c"
    break;

  case 71: /* lswizzle: lswizzle T_NUM  */
#line 205 "easm_parse.y"
                                { (yyval.expr) = (yyvsp[-1].expr); ADDARRAY((yyval.expr)->swizzles, ((struct easm_swizzle){0, (yyvsp[0].num)})); }
#line 1897 "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/build_O0/easm/easm_parse.c"
    break;

  case 72: /* membody: mods expr  */
#line 207 "easm_parse.y"
                                                { (yyval.expr) = easm_expr_un(EASM_EXPR_MEM, (yyvsp[0].expr)); (yyval.expr)->mods = (yyvsp[-1].mods); }
#line 1903 "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/build_O0/easm/easm_parse.c"
    break;

  case 73: /* membody: mods expr T_PLUSPLUS expr  */
#line 208 "easm_parse.y"
                                                { (yyval.expr) = easm_expr_bin(EASM_EXPR_MEMPP, (yyvsp[-2].expr), (yyvsp[0].expr)); (yyval.expr)->mods = (yyvsp[-3].mods); }
#line 1909 "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/build_O0/easm/easm_parse.c"
    break;

  case 74: /* membody: mods expr T_MINUSMINUS expr  */
#line 209 "easm_parse.y"
                                                { (yyval.expr) = easm_expr_bin(EASM_EXPR_MEMMM, (yyvsp[-2].expr), (yyvsp[0].expr)); (yyval.expr)->mods = (yyvsp[-3].mods); }
#line 1915 "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/build_O0/easm/easm_parse.c"
    break;

  case 75: /* membody: mods expr T_PLUSEQ expr  */
#line 210 "easm_parse.y"
                                                { (yyval.expr) = easm_expr_bin(EASM_EXPR_MEMPE, (yyvsp[-2].expr), (yyvsp[0].expr)); (yyval.expr)->mods = (yyvsp[-3].mods); }
#line 1921 "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/build_O0/easm/easm_parse.c"
    break;

  case 76: /* membody: mods expr T_MINUSEQ expr  */
#line 211 "easm_parse.y"
                                                { (yyval.expr) = easm_expr_bin(EASM_EXPR_MEMME, (yyvsp[-2].expr), (yyvsp[0].expr)); (yyval.expr)->mods = (yyvsp[-3].mods); }
#line 1927 "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/build_O0/easm/easm_parse.c"
    break;


#line 1931 "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/build_O0/easm/easm_parse.c"

      default: break;
    }
  /* User semantic actions sometimes alter yychar, and that requires
     that yytoken be updated with the new translation.  We take the
     approach of translating immediately before every use of yytoken.
     One alternative is translating here after every semantic action,
     but that translation would be missed if the semantic action invokes
     YYABORT, YYACCEPT, or YYERROR immediately after altering yychar or
     if it invokes YYBACKUP.  In the case of YYABORT or YYACCEPT, an
     incorrect destructor might then be invoked immediately.  In the
     case of YYERROR or YYBACKUP, subsequent parser actions might lead
     to an incorrect destructor call or verbose syntax error message
     before the lookahead is translated.  */
  YY_SYMBOL_PRINT ("-> $$ =", YY_CAST (yysymbol_kind_t, yyr1[yyn]), &yyval, &yyloc);

  YYPOPSTACK (yylen);
  yylen = 0;

  *++yyvsp = yyval;
  *++yylsp = yyloc;

  /* Now 'shift' the result of the reduction.  Determine what state
     that goes to, based on the state we popped back to and the rule
     number reduced by.  */
  {
    const int yylhs = yyr1[yyn] - YYNTOKENS;
    const int yyi = yypgoto[yylhs] + *yyssp;
    yystate = (0 <= yyi && yyi <= YYLAST && yycheck[yyi] == *yyssp
               ? yytable[yyi]
               : yydefgoto[yylhs]);
  }

  goto yynewstate;


/*--------------------------------------.
| yyerrlab -- here on detecting error.  |
`--------------------------------------*/
yyerrlab:
  /* Make sure we have latest lookahead translation.  See comments at
     user semantic actions for why this is necessary.  */
  yytoken = yychar == YYEMPTY ? YYSYMBOL_YYEMPTY : YYTRANSLATE (yychar);
  /* If not already recovering from an error, report this error.  */
  if (!yyerrstatus)
    {
      ++yynerrs;
      yyerror (&yylloc, lex_state, res, YY_("syntax error"));
    }

  yyerror_range[1] = yylloc;
  if (yyerrstatus == 3)
    {
      /* If just tried and failed to reuse lookahead token after an
         error, discard it.  */

      if (yychar <= YYEOF)
        {
          /* Return failure if at end of input.  */
          if (yychar == YYEOF)
            YYABORT;
        }
      else
        {
          yydestruct ("Error: discarding",
                      yytoken, &yylval, &yylloc, lex_state, res);
          yychar = YYEMPTY;
        }
    }

  /* Else will try to reuse lookahead token after shifting the error
     token.  */
  goto yyerrlab1;


/*---------------------------------------------------.
| yyerrorlab -- error raised explicitly by YYERROR.  |
`---------------------------------------------------*/
yyerrorlab:
  /* Pacify compilers when the user code never invokes YYERROR and the
     label yyerrorlab therefore never appears in user code.  */
  if (0)
    YYERROR;
  ++yynerrs;

  /* Do not reclaim the symbols of the rule whose action triggered
     this YYERROR.  */
  YYPOPSTACK (yylen);
  yylen = 0;
  YY_STACK_PRINT (yyss, yyssp);
  yystate = *yyssp;
  goto yyerrlab1;


/*-------------------------------------------------------------.
| yyerrlab1 -- common code for both syntax error and YYERROR.  |
`-------------------------------------------------------------*/
yyerrlab1:
  yyerrstatus = 3;      /* Each real token shifted decrements this.  */

  /* Pop stack until we find a state that shifts the error token.  */
  for (;;)
    {
      yyn = yypact[yystate];
      if (!yypact_value_is_default (yyn))
        {
          yyn += YYSYMBOL_YYerror;
          if (0 <= yyn && yyn <= YYLAST && yycheck[yyn] == YYSYMBOL_YYerror)
            {
              yyn = yytable[yyn];
              if (0 < yyn)
                break;
            }
        }

      /* Pop the current state because it cannot handle the error token.  */
      if (yyssp == yyss)
        YYABORT;

      yyerror_range[1] = *yylsp;
      yydestruct ("Error: popping",
                  YY_ACCESSING_SYMBOL (yystate), yyvsp, yylsp, lex_state, res);
      YYPOPSTACK (1);
      yystate = *yyssp;
      YY_STACK_PRINT (yyss, yyssp);
    }

  YY_IGNORE_MAYBE_UNINITIALIZED_BEGIN
  *++yyvsp = yylval;
  YY_IGNORE_MAYBE_UNINITIALIZED_END

  yyerror_range[2] = yylloc;
  ++yylsp;
  YYLLOC_DEFAULT (*yylsp, yyerror_range, 2);

  /* Shift the error token.  */
  YY_SYMBOL_PRINT ("Shifting", YY_ACCESSING_SYMBOL (yyn), yyvsp, yylsp);

  yystate = yyn;
  goto yynewstate;


/*-------------------------------------.
| yyacceptlab -- YYACCEPT comes here.  |
`-------------------------------------*/
yyacceptlab:
  yyresult = 0;
  goto yyreturnlab;


/*-----------------------------------.
| yyabortlab -- YYABORT comes here.  |
`-----------------------------------*/
yyabortlab:
  yyresult = 1;
  goto yyreturnlab;


/*-----------------------------------------------------------.
| yyexhaustedlab -- YYNOMEM (memory exhaustion) comes here.  |
`-----------------------------------------------------------*/
yyexhaustedlab:
  yyerror (&yylloc, lex_state, res, YY_("memory exhausted"));
  yyresult = 2;
  goto yyreturnlab;


/*----------------------------------------------------------.
| yyreturnlab -- parsing is finished, clean up and return.  |
`----------------------------------------------------------*/
yyreturnlab:
  if (yychar != YYEMPTY)
    {
      /* Make sure we have latest lookahead translation.  See comments at
         user semantic actions for why this is necessary.  */
      yytoken = YYTRANSLATE (yychar);
      yydestruct ("Cleanup: discarding lookahead",
                  yytoken, &yylval, &yylloc, lex_state, res);
    }
  /* Do not reclaim the symbols of the rule whose action triggered
     this YYABORT or YYACCEPT.  */
  YYPOPSTACK (yylen);
  YY_STACK_PRINT (yyss, yyssp);
  while (yyssp != yyss)
    {
      yydestruct ("Cleanup: popping",
                  YY_ACCESSING_SYMBOL (+*yyssp), yyvsp, yylsp, lex_state, res);
      YYPOPSTACK (1);
    }
#ifndef yyoverflow
  if (yyss != yyssa)
    YYSTACK_FREE (yyss);
#endif

  return yyresult;
}